

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

InplaceStr GetModuleName(Allocator *allocator,char *moduleRoot,IntrusiveList<SynIdentifier> parts)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  char *pcVar4;
  SynIdentifier *pSVar5;
  SynIdentifier *local_60;
  SynIdentifier *part_1;
  char *pos;
  char *path;
  SynIdentifier *part;
  uint pathLength;
  char *moduleRoot_local;
  Allocator *allocator_local;
  IntrusiveList<SynIdentifier> parts_local;
  SynIdentifier *__dest;
  
  parts_local.head = parts.tail;
  allocator_local = (Allocator *)parts.head;
  uVar1 = IntrusiveList<SynIdentifier>::size((IntrusiveList<SynIdentifier> *)&allocator_local);
  part._4_4_ = uVar1 + 2;
  if (moduleRoot != (char *)0x0) {
    sVar3 = strlen(moduleRoot);
    part._4_4_ = (int)sVar3 + 1 + part._4_4_;
  }
  for (path = (char *)allocator_local; path != (char *)0x0;
      path = (char *)getType<SynIdentifier>(*(SynBase **)(path + 0x30))) {
    uVar1 = InplaceStr::length((InplaceStr *)(path + 0x40));
    part._4_4_ = uVar1 + part._4_4_;
  }
  iVar2 = (*allocator->_vptr_Allocator[2])(allocator,(ulong)(part._4_4_ + 1));
  __dest = (SynIdentifier *)CONCAT44(extraout_var,iVar2);
  part_1 = __dest;
  if (moduleRoot != (char *)0x0) {
    strcpy((char *)__dest,moduleRoot);
    sVar3 = strlen(moduleRoot);
    pcVar4 = (char *)((long)&(__dest->super_SynBase)._vptr_SynBase + sVar3);
    part_1 = (SynIdentifier *)(pcVar4 + 1);
    *pcVar4 = '/';
  }
  for (local_60 = (SynIdentifier *)allocator_local; local_60 != (SynIdentifier *)0x0;
      local_60 = getType<SynIdentifier>((local_60->super_SynBase).next)) {
    pcVar4 = (local_60->name).begin;
    uVar1 = InplaceStr::length(&local_60->name);
    memcpy(part_1,pcVar4,(ulong)uVar1);
    uVar1 = InplaceStr::length(&local_60->name);
    pSVar5 = (SynIdentifier *)((long)&(part_1->super_SynBase)._vptr_SynBase + (ulong)uVar1);
    part_1 = pSVar5;
    if ((local_60->super_SynBase).next != (SynBase *)0x0) {
      part_1 = (SynIdentifier *)((long)&(pSVar5->super_SynBase)._vptr_SynBase + 1);
      *(undefined1 *)&(pSVar5->super_SynBase)._vptr_SynBase = 0x2f;
    }
  }
  strcpy((char *)part_1,".nc");
  *(undefined1 *)((long)&(part_1->super_SynBase)._vptr_SynBase + 3) = 0;
  InplaceStr::InplaceStr((InplaceStr *)&parts_local.tail,(char *)__dest);
  return stack0xffffffffffffffe8;
}

Assistant:

InplaceStr GetModuleName(Allocator *allocator, const char *moduleRoot, IntrusiveList<SynIdentifier> parts)
{
	unsigned pathLength = unsigned(parts.size() - 1 + strlen(".nc"));

	if(moduleRoot)
		pathLength += unsigned(strlen(moduleRoot)) + 1;

	for(SynIdentifier *part = parts.head; part; part = getType<SynIdentifier>(part->next))
		pathLength += part->name.length();

	char *path = (char*)allocator->alloc(pathLength + 1);

	char *pos = path;

	if(moduleRoot)
	{
		strcpy(pos, moduleRoot);
		pos += strlen(moduleRoot);

		*pos++ = '/';
	}

	for(SynIdentifier *part = parts.head; part; part = getType<SynIdentifier>(part->next))
	{
		memcpy(pos, part->name.begin, part->name.length());
		pos += part->name.length();

		if(part->next)
			*pos++ = '/';
	}

	strcpy(pos, ".nc");
	pos += strlen(".nc");

	*pos = 0;

	return InplaceStr(path);
}